

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

int portability_path_separator_normalize_inplace(char *path,size_t size)

{
  char separator;
  size_t iterator;
  size_t size_local;
  char *path_local;
  int local_4;
  
  if (path == (char *)0x0) {
    local_4 = 1;
  }
  else {
    separator = '\0';
    for (iterator = 0; iterator < size; iterator = iterator + 1) {
      if ((path[iterator] == '\\') || (path[iterator] == '/')) {
        if (separator == '\0') {
          separator = '/';
        }
        else {
          path[iterator] = separator;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int portability_path_separator_normalize_inplace(char *path, size_t size)
{
	if (path == NULL)
	{
		return 1;
	}

	size_t iterator;
	char separator = 0;

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (PORTABILITY_PATH_SEPARATOR_ALL(path[iterator]))
		{
			if (separator == 0)
			{
				separator = PORTABILITY_PATH_SEPARATOR_C; /* Use current platform style as default */
			}
			else
			{
				path[iterator] = separator;
			}
		}
	}

	return 0;
}